

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O3

void __thiscall
mjs::function_object::put_prototype_with_attributes
          (function_object *this,object_ptr *p,property_attribute attributes)

{
  uint uVar1;
  value_representation local_48;
  undefined1 local_40 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_38;
  
  local_40 = (undefined1  [8])0x9;
  local_38.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x1a55a4;
  uVar1 = (*(this->super_native_object).super_object._vptr_object[6])();
  if (0x10 < uVar1) {
    __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                  ,0x24,"bool mjs::is_valid(property_attribute)");
  }
  if (uVar1 != 0x10) {
    local_40._0_4_ = object;
    local_38.n_ = (double)(p->super_gc_heap_ptr_untyped).heap_;
    local_38.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         (p->super_gc_heap_ptr_untyped).pos_;
    if (local_38.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
        (gc_heap *)0x0) {
      gc_heap::attach(local_38.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
                      (gc_heap_ptr_untyped *)(local_40 + 8));
    }
    value_representation::value_representation(&local_48,(value *)local_40);
    (this->prototype_prop_).repr_ = local_48.repr_;
    value::destroy((value *)local_40);
    native_object::update_property_attributes(&this->super_native_object,"prototype",attributes);
    return;
  }
  __assert_fail("is_valid(object::own_property_attributes(L\"prototype\"))",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x1d,
                "void mjs::function_object::put_prototype_with_attributes(const object_ptr &, property_attribute)"
               );
}

Assistant:

void put_prototype_with_attributes(const object_ptr& p, property_attribute attributes) {
        assert(is_valid(object::own_property_attributes(L"prototype")));
        prototype_prop_ = value_representation{value{p}};
        update_property_attributes("prototype", attributes);
    }